

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseVASection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte *pbVar1;
  byte bVar2;
  pointer pFVar3;
  void *pvVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  SMDImporter *this_00;
  long lVar8;
  int iTime;
  byte *apbStack_120 [2];
  ulong local_110;
  vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_> *local_108;
  char **local_100;
  Face local_f8;
  
  local_108 = &this->asTriangles;
  local_110 = 0;
  local_100 = szCurrentOut;
  do {
    this->iLineNumber = this->iLineNumber + 1;
    while (((ulong)(byte)*szCurrent < 0x21 &&
           ((0x100002600U >> ((ulong)(byte)*szCurrent & 0x3f) & 1) != 0))) {
      szCurrent = (char *)((byte *)szCurrent + 1);
    }
    apbStack_120[1] = (byte *)szCurrent;
    if (*szCurrent == 0) goto LAB_0060a8a0;
    iVar7 = (byte)*szCurrent - 0x65;
    if ((iVar7 == 0) && (iVar7 = ((byte *)szCurrent)[1] - 0x6e, iVar7 == 0)) {
      iVar7 = 100 - (uint)((byte *)szCurrent)[2];
    }
    else {
      iVar7 = -iVar7;
    }
    if (iVar7 == 0) {
      bVar2 = ((byte *)szCurrent)[3];
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        apbStack_120[1] = (byte *)szCurrent + (4 - (ulong)(bVar2 == 0));
LAB_0060a8a0:
        if (((int)local_110 != 2) &&
           (pFVar3 = (this->asTriangles).
                     super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
           (this->asTriangles).
           super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
           super__Vector_impl_data._M_start != pFVar3)) {
          (this->asTriangles).
          super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
          super__Vector_impl_data._M_finish = pFVar3 + -1;
          lVar8 = -0x18;
          do {
            pvVar4 = *(void **)((long)pFVar3->avVertices + lVar8 + -8);
            if (pvVar4 != (void *)0x0) {
              apbStack_120[0] = (byte *)0x60a8da;
              operator_delete(pvVar4);
            }
            lVar8 = lVar8 + -0x40;
          } while (lVar8 != -0xd8);
        }
        this->iLineNumber = this->iLineNumber + 1;
        while (((ulong)*apbStack_120[1] < 0x21 &&
               ((0x100002600U >> ((ulong)*apbStack_120[1] & 0x3f) & 1) != 0))) {
          apbStack_120[1] = apbStack_120[1] + 1;
        }
        *local_100 = (char *)apbStack_120[1];
        return;
      }
    }
    this_00 = (SMDImporter *)0x76a15d;
    apbStack_120[0] = (byte *)0x60a737;
    iVar7 = strncmp("time",szCurrent,4);
    if (iVar7 == 0) {
      bVar2 = ((byte *)szCurrent)[4];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_0060a7cf;
      apbStack_120[1] = (byte *)szCurrent + 5;
      if (bVar2 == 0) {
        apbStack_120[1] = (byte *)szCurrent + 4;
      }
      local_f8.iTexture = 0;
      apbStack_120[0] = (byte *)0x60a77e;
      bVar6 = ParseSignedInt(this_00,(char *)apbStack_120[1],(char **)(apbStack_120 + 1),
                             (int *)&local_f8);
      if ((!bVar6) ||
         (szCurrent = (char *)apbStack_120[1], this->configFrameID != local_f8.iTexture))
      goto LAB_0060a8a0;
      while( true ) {
        bVar2 = *szCurrent;
        if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        szCurrent = (char *)((byte *)szCurrent + 1);
      }
      while ((bVar2 == 0xd || (bVar2 == 10))) {
        pbVar1 = (byte *)szCurrent + 1;
        szCurrent = (char *)((byte *)szCurrent + 1);
        bVar2 = *pbVar1;
      }
      this->iLineNumber = this->iLineNumber + 1;
    }
    else {
LAB_0060a7cf:
      iVar7 = (int)local_110;
      if (iVar7 == 0) {
        local_f8.iTexture = 0;
        lVar8 = 0x30;
        do {
          *(undefined8 *)((long)&local_110 + lVar8) = 0;
          *(undefined8 *)((long)&local_108 + lVar8) = 0;
          *(undefined8 *)((long)apbStack_120 + lVar8) = 0;
          *(undefined8 *)((long)apbStack_120 + lVar8 + 8) = 0;
          *(undefined8 *)((long)local_f8.avVertices + lVar8 + -0x10) = 0xffffffff00000000;
          *(undefined8 *)((long)local_f8.avVertices + lVar8 + -8) = 0;
          *(undefined8 *)((long)&local_f8.avVertices[0].pos.x + lVar8) = 0;
          *(undefined8 *)((long)&local_f8.avVertices[0].pos.z + lVar8) = 0;
          lVar8 = lVar8 + 0x40;
        } while (lVar8 != 0xf0);
        apbStack_120[0] = (byte *)0x60a82a;
        std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
        emplace_back<Assimp::SMD::Face>(local_108,&local_f8);
        lVar8 = 0xc0;
        do {
          if (*(void **)((long)&local_108 + lVar8) != (void *)0x0) {
            apbStack_120[0] = (byte *)0x60a83f;
            operator_delete(*(void **)((long)&local_108 + lVar8));
          }
          lVar8 = lVar8 + -0x40;
        } while (lVar8 != 0);
        iVar7 = (int)local_110;
        szCurrent = (char *)apbStack_120[1];
      }
      uVar5 = iVar7 + 1U;
      if (iVar7 + 1U == 3) {
        uVar5 = 0;
      }
      local_110 = (ulong)uVar5;
      apbStack_120[0] = (byte *)0x60a889;
      ParseVertex(this,szCurrent,(char **)(apbStack_120 + 1),
                  (Vertex *)
                  ((long)(this->asTriangles).
                         super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                         _M_impl.super__Vector_impl_data._M_finish + local_110 * 0x40 + -0xc0),true)
      ;
      szCurrent = (char *)apbStack_120[1];
    }
  } while( true );
}

Assistant:

void SMDImporter::ParseVASection(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iCurIndex = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the "vertexanimation" section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }

        // "time <n>\n"
        if (TokenMatch(szCurrent,"time",4)) {
            // NOTE: The doc says that time values COULD be negative ...
            // NOTE2: this is the shape key -> valve docs
            int iTime = 0;
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime) || configFrameID != (unsigned int)iTime) {
                break;
            }
            SkipLine(szCurrent,&szCurrent);
        } else {
            if(0 == iCurIndex) {
                asTriangles.push_back(SMD::Face());
            }
            if (++iCurIndex == 3) {
                iCurIndex = 0;
            }
            ParseVertex(szCurrent,&szCurrent,asTriangles.back().avVertices[iCurIndex],true);
        }
    }

    if (iCurIndex != 2 && !asTriangles.empty()) {
        // we want to no degenerates, so throw this triangle away
        asTriangles.pop_back();
    }

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}